

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O2

void zmMontCreate(qr_o *r,octet *mod,size_t no,size_t l,void *stack)

{
  u64 uVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  
  r->n = no + 7 >> 3;
  r->no = no;
  r->mod = (word *)(r + 1);
  u64From((u64 *)(r + 1),mod,no);
  r->unity = r->mod + r->n;
  wwSetZero(r->mod + r->n,r->n);
  if (r->n << 6 == l) {
    zzSub2(r->unity,r->mod,r->n);
  }
  else {
    wwSetBit(r->unity,l,1);
  }
  zzMod(r->unity,r->unity,r->n,r->mod,r->n,stack);
  r->params = r->unity + r->n;
  uVar1 = u64NegInv(*r->mod);
  *(u64 *)r->params = uVar1;
  *(size_t *)((long)r->params + 8) = l;
  r->from = zmFrom;
  r->to = zmTo;
  r->add = zmAdd2;
  r->sub = zmSub2;
  r->neg = zmNeg2;
  r->mul = zmMulMont2;
  r->sqr = zmSqrMont2;
  r->inv = zmInvMont2;
  r->div = zmDivMont2;
  sVar2 = zmMulMont2_deep(r->n);
  sVar4 = r->n;
  sVar3 = zzSqr_deep(sVar4);
  sVar4 = zzRedMont_deep(sVar4);
  sVar3 = utilMax(2,sVar3,sVar4);
  sVar5 = zzAlmostInvMod_deep(r->n);
  sVar4 = r->n;
  sVar6 = zzAlmostInvMod_deep(sVar4);
  sVar4 = zmMulMont2_deep(sVar4);
  sVar4 = utilMax(2,sVar6,sVar4);
  sVar4 = utilMax(4,sVar2,sVar3,sVar5,sVar4);
  r->deep = sVar4;
  (r->hdr).keep = r->n * 0x10 + 0xa0;
  (r->hdr).p_count = 3;
  (r->hdr).o_count = 0;
  return;
}

Assistant:

void zmMontCreate(qr_o* r, const octet mod[], size_t no, size_t l, void* stack)
{
	ASSERT(memIsValid(r, sizeof(qr_o)));
	ASSERT(memIsValid(mod, no));
	ASSERT(no > 0 && mod[no - 1] > 0);
	ASSERT(mod[0] % 2 != 0);
	// зафиксировать размерности
	r->n = W_OF_O(no);
	r->no = no;
	// зафиксировать модуль
	r->mod = (word*)r->descr;
	wwFrom(r->mod, mod, no);
	ASSERT(wwBitSize(r->mod, r->n) <= l && B_OF_W(r->n) >= l);
	// подготовить единицу: unity <- R \mod mod
	r->unity = r->mod + r->n;
	wwSetZero(r->unity, r->n);
	if (l == B_OF_W(r->n))
		zzSub2(r->unity, r->mod, r->n);
	else
		wwSetBit(r->unity, l, 1);
	zzMod(r->unity, r->unity, r->n, r->mod, r->n, stack);
	// подготовить параметры
	r->params = r->unity + r->n;
	((zm_mont_params_st*)r->params)->m0 = wordNegInv(r->mod[0]);
	((zm_mont_params_st*)r->params)->l = l;
	// настроить функции
	r->from = zmFrom;
	r->to = zmTo;
	r->add = zmAdd2;
	r->sub = zmSub2;
	r->neg = zmNeg2;
	r->mul = zmMulMont2;
	r->sqr = zmSqrMont2;
	r->inv = zmInvMont2;
	r->div = zmDivMont2;
	r->deep = utilMax(4,
		zmMulMont2_deep(r->n),
		zmSqrMont2_deep(r->n),
		zmInvMont2_deep(r->n),
		zmDivMont2_deep(r->n));
	// настроить заголовок
	r->hdr.keep = sizeof(qr_o) + O_OF_W(2 * r->n) + sizeof(zm_mont_params_st);
	r->hdr.p_count = 3;
	r->hdr.o_count = 0;
}